

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

void __thiscall
glcts::ViewportArray::Utils::texture::get(texture *this,GLenum format,GLenum type,GLvoid *out_data)

{
  GLuint GVar1;
  GLuint GVar2;
  code *pcVar3;
  Functions *pFVar4;
  GLenum GVar5;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  RenderContext *pRVar9;
  undefined4 extraout_var;
  TestError *pTVar11;
  reference pvVar12;
  socklen_t __len;
  sockaddr *__addr;
  uint local_84;
  GLuint elem;
  GLint *out_data_int;
  GLuint layer;
  GLuint layer_size;
  vector<int,_std::allocator<int>_> read_data;
  undefined4 local_44;
  undefined4 local_40;
  GLenum read_format;
  GLuint temp_fbo;
  ApiType local_34;
  GLenum textarget;
  ContextType *context_type;
  Functions *gl;
  GLvoid *out_data_local;
  GLenum type_local;
  GLenum format_local;
  texture *this_local;
  ContextType *pCVar10;
  
  gl = (Functions *)out_data;
  out_data_local._0_4_ = type;
  out_data_local._4_4_ = format;
  _type_local = this;
  pRVar9 = deqp::Context::getRenderContext(this->m_context);
  iVar7 = (*pRVar9->_vptr_RenderContext[3])();
  pCVar10 = (ContextType *)CONCAT44(extraout_var,iVar7);
  context_type = pCVar10;
  pRVar9 = deqp::Context::getRenderContext(this->m_context);
  __len = (socklen_t)pCVar10;
  local_34.m_bits = (*pRVar9->_vptr_RenderContext[2])();
  _textarget = &local_34;
  bind(this,format,__addr,__len);
  temp_fbo = 0xde1;
  if ((this->m_is_array & 1U) == 1) {
    temp_fbo = 0x8c1a;
  }
  read_format = _textarget->m_bits;
  bVar6 = glu::isContextTypeGLCore((ContextType)read_format);
  if (bVar6) {
    (**(code **)(context_type + 0x2a8))(temp_fbo,0,out_data_local._4_4_,(GLenum)out_data_local,gl);
    dVar8 = (**(code **)(context_type + 0x200))();
    glu::checkError(dVar8,"GetTexImage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x32a);
  }
  else {
    local_40 = 0;
    (**(code **)(context_type + 0x1b4))(1,&local_40);
    (**(code **)(context_type + 0x1e))(0x8ca8,local_40);
    if (out_data_local._4_4_ == 0x1903) {
      local_44 = 0x1908;
    }
    else {
      if (out_data_local._4_4_ != 0x8d94) {
        pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar11,"unexpected format",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                   ,0x342);
        __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      local_44 = 0x8d99;
    }
    if (((GLenum)out_data_local != 0x1404) && ((GLenum)out_data_local != 0x1406)) {
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar11,"unexpected type",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                 ,0x347);
      __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&layer);
    iVar7 = this->m_width * this->m_height * 4;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&layer,(ulong)(iVar7 * this->m_depth));
    if ((this->m_is_array & 1U) == 0) {
      (**(code **)(context_type + 0x1a8))(0x8ca8,0x8ce0,temp_fbo,this->m_id,0);
      GVar5 = (GLenum)out_data_local;
      pcVar3 = *(code **)(context_type + 0x488);
      GVar1 = this->m_width;
      GVar2 = this->m_height;
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)&layer,0);
      (*pcVar3)(0,0,GVar1,GVar2,local_44,GVar5,pvVar12);
    }
    else {
      for (out_data_int._0_4_ = 0; (uint)out_data_int < this->m_depth;
          out_data_int._0_4_ = (uint)out_data_int + 1) {
        (**(code **)(context_type + 0x1ae))(0x8ca8,0x8ce0,this->m_id,0,(uint)out_data_int);
        GVar5 = (GLenum)out_data_local;
        pcVar3 = *(code **)(context_type + 0x488);
        GVar1 = this->m_width;
        GVar2 = this->m_height;
        pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)&layer,
                             (ulong)((uint)out_data_int * iVar7));
        (*pcVar3)(0,0,GVar1,GVar2,local_44,GVar5,pvVar12);
      }
    }
    dVar8 = (**(code **)(context_type + 0x200))();
    glu::checkError(dVar8,"ReadPixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x35a);
    (**(code **)(context_type + 0x110))(1,&local_40);
    pFVar4 = gl;
    for (local_84 = 0; local_84 < this->m_width * this->m_height * this->m_depth;
        local_84 = local_84 + 1) {
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)&layer,(ulong)(local_84 << 2));
      *(value_type *)((long)&pFVar4->activeShaderProgram + (ulong)local_84 * 4) = *pvVar12;
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&layer);
  }
  return;
}

Assistant:

void Utils::texture::get(glw::GLenum format, glw::GLenum type, glw::GLvoid* out_data) const
{
	const glw::Functions&   gl			 = m_context.getRenderContext().getFunctions();
	const glu::ContextType& context_type = m_context.getRenderContext().getType();

	bind();

	GLenum textarget = GL_TEXTURE_2D;

	if (true == m_is_array)
	{
		textarget = GL_TEXTURE_2D_ARRAY;
	}

	if (glu::isContextTypeGLCore(context_type))
	{
		gl.getTexImage(textarget, 0 /* level */, format, type, out_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexImage");
	}
	else
	{
		DE_ASSERT(glu::isContextTypeES(context_type));

		GLuint temp_fbo = 0;
		gl.genFramebuffers(1, &temp_fbo);
		gl.bindFramebuffer(GL_READ_FRAMEBUFFER, temp_fbo);

		/* OpenGL ES only guarantees support for RGBA formats of each type.
		Since the tests are only expecting single-channel formats, we read them back
		in RGBA to a temporary buffer and then copy only the first component
		to the actual output buffer */
		GLenum read_format = format;
		switch (format)
		{
		case GL_RED:
			read_format = GL_RGBA;
			break;
		case GL_RED_INTEGER:
			read_format = GL_RGBA_INTEGER;
			break;
		default:
			TCU_FAIL("unexpected format");
		}
		/* we can get away just handling one type of data, as long as the components are the same size */
		if (type != GL_INT && type != GL_FLOAT)
		{
			TCU_FAIL("unexpected type");
		}
		std::vector<GLint> read_data;
		const GLuint	   layer_size = m_width * m_height * 4;
		read_data.resize(layer_size * m_depth);

		if (m_is_array)
		{
			for (GLuint layer = 0; layer < m_depth; ++layer)
			{
				gl.framebufferTextureLayer(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_id, 0, layer);
				gl.readPixels(0, 0, m_width, m_height, read_format, type, &read_data[layer * layer_size]);
			}
		}
		else
		{
			gl.framebufferTexture2D(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, textarget, m_id, 0);
			gl.readPixels(0, 0, m_width, m_height, read_format, type, &read_data[0]);
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "ReadPixels");
		gl.deleteFramebuffers(1, &temp_fbo);

		/* copy the first channel from the readback buffer to the output buffer */
		GLint* out_data_int = (GLint*)out_data;
		for (GLuint elem = 0; elem < (m_width * m_height * m_depth); ++elem)
		{
			out_data_int[elem] = read_data[elem * 4];
		}
	}
}